

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::error_handler>
              (void)

{
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    if ((long)_iStack0000000000000008 < 0) {
LAB_00165a40:
      throw_format_error("negative precision");
    }
    goto LAB_00165a57;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
    if ((long)_iStack0000000000000008 < 0) goto LAB_00165a40;
    break;
  case 5:
    if (arg < 0) goto LAB_00165a40;
  case 4:
  case 6:
    break;
  default:
    throw_format_error("precision is not integer");
  }
  if (_iStack0000000000000008 >> 0x1f != 0) {
    throw_format_error("number is too big");
  }
LAB_00165a57:
  return (int)_iStack0000000000000008;
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}